

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiKeyRoutingData * ImGui::GetShortcutRoutingData(ImGuiKeyChord key_chord)

{
  ImVector<ImGuiKeyRoutingData> *pIVar1;
  int iVar2;
  ImGuiKeyRoutingData *pIVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  ImGuiKeyRoutingData *pIVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  short sVar11;
  int iVar12;
  ImGuiKeyRoutingData *pIVar13;
  
  pIVar4 = GImGui;
  uVar9 = key_chord & 0xf000;
  uVar7 = key_chord & 0xffff0fffU;
  if ((((key_chord & 0xffff0fffU) == 0) && (uVar7 = uVar9, key_chord - 0x1000U < 0x8000)) &&
     (uVar10 = key_chord - 0x1000U >> 0xc, (0x8bU >> (uVar10 & 0x1f) & 1) != 0)) {
    uVar7 = *(uint *)(&DAT_001f6930 + (ulong)uVar10 * 4);
  }
  pIVar13 = (ImGuiKeyRoutingData *)
            ((long)&GImGui->KeysOwnerData[0x45].OwnerCurr + (long)(int)uVar7 * 2);
  pIVar6 = pIVar13;
  do {
    lVar8 = (long)pIVar6->NextEntryIndex;
    if (lVar8 == -1) {
      iVar2 = (GImGui->KeysRoutingTable).Entries.Size;
      if (iVar2 == (GImGui->KeysRoutingTable).Entries.Capacity) {
        if (iVar2 == 0) {
          iVar5 = 8;
        }
        else {
          iVar5 = iVar2 / 2 + iVar2;
        }
        iVar12 = iVar2 + 1;
        if (iVar2 + 1 < iVar5) {
          iVar12 = iVar5;
        }
        pIVar6 = (ImGuiKeyRoutingData *)MemAlloc((long)iVar12 << 4);
        pIVar3 = (pIVar4->KeysRoutingTable).Entries.Data;
        if (pIVar3 != (ImGuiKeyRoutingData *)0x0) {
          memcpy(pIVar6,pIVar3,(long)(pIVar4->KeysRoutingTable).Entries.Size << 4);
          MemFree((pIVar4->KeysRoutingTable).Entries.Data);
        }
        (pIVar4->KeysRoutingTable).Entries.Data = pIVar6;
        (pIVar4->KeysRoutingTable).Entries.Capacity = iVar12;
        iVar5 = (pIVar4->KeysRoutingTable).Entries.Size;
      }
      else {
        pIVar6 = (GImGui->KeysRoutingTable).Entries.Data;
        iVar5 = iVar2;
      }
      pIVar6[iVar5].NextEntryIndex = -1;
      pIVar6[iVar5].Mods = 0;
      pIVar6[iVar5].RoutingCurrScore = 0xff;
      pIVar6[iVar5].RoutingNextScore = 0xff;
      pIVar6[iVar5].RoutingCurr = 0xffffffff;
      pIVar6[iVar5].RoutingNext = 0xffffffff;
      pIVar1 = &(pIVar4->KeysRoutingTable).Entries;
      pIVar1->Size = pIVar1->Size + 1;
      pIVar6 = (pIVar4->KeysRoutingTable).Entries.Data;
      sVar11 = (short)iVar2;
      pIVar6[sVar11].Mods = (ImU16)uVar9;
      pIVar6[sVar11].NextEntryIndex = pIVar13->NextEntryIndex;
      pIVar13->NextEntryIndex = sVar11;
      return pIVar6 + sVar11;
    }
    pIVar3 = (GImGui->KeysRoutingTable).Entries.Data;
    pIVar6 = pIVar3 + lVar8;
  } while (uVar9 != pIVar3[lVar8].Mods);
  return pIVar6;
}

Assistant:

ImGuiKeyRoutingData* ImGui::GetShortcutRoutingData(ImGuiKeyChord key_chord)
{
    // Majority of shortcuts will be Key + any number of Mods
    // We accept _Single_ mod with ImGuiKey_None.
    //  - Shortcut(ImGuiKey_S | ImGuiMod_Ctrl);                    // Legal
    //  - Shortcut(ImGuiKey_S | ImGuiMod_Ctrl | ImGuiMod_Shift);   // Legal
    //  - Shortcut(ImGuiMod_Ctrl);                                 // Legal
    //  - Shortcut(ImGuiMod_Ctrl | ImGuiMod_Shift);                // Not legal
    ImGuiContext& g = *GImGui;
    ImGuiKeyRoutingTable* rt = &g.KeysRoutingTable;
    ImGuiKeyRoutingData* routing_data;
    ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
    ImGuiKey mods = (ImGuiKey)(key_chord & ImGuiMod_Mask_);
    if (key == ImGuiKey_None)
        key = ConvertSingleModFlagToKey(mods);
    IM_ASSERT(IsNamedKey(key));

    // Get (in the majority of case, the linked list will have one element so this should be 2 reads.
    // Subsequent elements will be contiguous in memory as list is sorted/rebuilt in NewFrame).
    for (ImGuiKeyRoutingIndex idx = rt->Index[key - ImGuiKey_NamedKey_BEGIN]; idx != -1; idx = routing_data->NextEntryIndex)
    {
        routing_data = &rt->Entries[idx];
        if (routing_data->Mods == mods)
            return routing_data;
    }

    // Add to linked-list
    ImGuiKeyRoutingIndex routing_data_idx = (ImGuiKeyRoutingIndex)rt->Entries.Size;
    rt->Entries.push_back(ImGuiKeyRoutingData());
    routing_data = &rt->Entries[routing_data_idx];
    routing_data->Mods = (ImU16)mods;
    routing_data->NextEntryIndex = rt->Index[key - ImGuiKey_NamedKey_BEGIN]; // Setup linked list
    rt->Index[key - ImGuiKey_NamedKey_BEGIN] = routing_data_idx;
    return routing_data;
}